

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O2

PCRE2_SPTR16
compile_ref_iterator_matchingpath(compiler_common *common,PCRE2_SPTR16 cc,backtrack_common *parent)

{
  PCRE2_UCHAR16 PVar1;
  ushort uVar2;
  sljit_compiler *compiler;
  uint uVar3;
  backtrack_common *pbVar4;
  sljit_jump *psVar5;
  sljit_label *psVar6;
  sljit_jump *psVar7;
  backtrack_common *pbVar8;
  sljit_s32 sVar9;
  sljit_sw sVar10;
  ushort uVar11;
  ulong uVar12;
  uint uVar13;
  uint local_70;
  sljit_jump *local_60;
  ulong local_50;
  ushort *local_38;
  
  compiler = common->compiler;
  PVar1 = *cc;
  pbVar4 = (backtrack_common *)sljit_alloc_memory(compiler,0x30);
  uVar13 = 0;
  if (compiler->error != 0) {
    return (PCRE2_SPTR16)0x0;
  }
  uVar11 = PVar1 - 0x71;
  pbVar4->cc = (PCRE2_SPTR16)0x0;
  pbVar4[1].prev = (backtrack_common *)0x0;
  pbVar4->top = (backtrack_common *)0x0;
  pbVar4->topbacktracks = (jump_list *)0x0;
  pbVar4->prev = (backtrack_common *)0x0;
  pbVar4->nextbacktracks = (jump_list *)0x0;
  pbVar4->prev = parent->top;
  pbVar4->cc = cc;
  parent->top = pbVar4;
  local_38 = cc + 1;
  if (uVar11 < 2) {
    uVar13 = (uint)cc[1] * 2;
    local_38 = cc;
  }
  uVar2 = local_38[2];
  local_50 = 0;
  switch(uVar2) {
  case 0x62:
  case 99:
    local_38 = local_38 + 3;
  default:
    local_70 = 0;
    break;
  case 100:
  case 0x65:
    local_38 = local_38 + 3;
    local_70 = 0;
    local_50 = 1;
    uVar3 = 0;
    if ((uVar2 & 1) != 0) goto LAB_0014079e;
    goto LAB_001406d1;
  case 0x66:
  case 0x67:
    local_70 = 1;
    local_38 = local_38 + 3;
    break;
  case 0x68:
  case 0x69:
    local_50 = (ulong)local_38[3];
    local_70 = (uint)local_38[4];
    local_38 = local_38 + 5;
  }
  uVar3 = local_70;
  if ((uVar2 & 1) != 0) {
LAB_0014079e:
    allocate_stack(common,3 - (uint)(uVar11 < 2));
    uVar12 = (ulong)uVar13;
    if (uVar11 < 2) {
      sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->ovector_start + uVar12 * 8);
    }
    sljit_emit_op1(compiler,0x20,0x8c,0,0x40,0);
    if (uVar2 != 99) {
      sljit_emit_op1(compiler,0x20,0x8c,8,0x40,0);
    }
    if ((uint)local_50 == 0) {
      if (uVar11 < 2) {
        sVar10 = (long)common->ovector_start + uVar12 * 8 + 8;
        sVar9 = 0x8e;
      }
      else {
        compile_dnref_search(common,cc,(jump_list **)0x0);
        sljit_emit_op1(compiler,0x20,1,0,0x84,0);
        sljit_emit_op1(compiler,0x20,0x8c,0x10,4,0);
        sVar10 = 8;
        sVar9 = 0x84;
      }
      local_60 = sljit_emit_cmp(compiler,0,1,0,sVar9,sVar10);
      sljit_emit_op1(compiler,0x20,0x8c,0,2,0);
      psVar5 = sljit_emit_jump(compiler,0x18);
    }
    else {
      if (uVar11 < 2) {
        psVar5 = sljit_emit_cmp(compiler,0,1,0,0x8e,(long)common->ovector_start + 8);
        add_jump(compiler,&pbVar4->topbacktracks,psVar5);
        sVar10 = (long)common->ovector_start + uVar12 * 8 + 8;
        sVar9 = 0x8e;
      }
      else {
        compile_dnref_search(common,cc,&pbVar4->topbacktracks);
        sljit_emit_op1(compiler,0x20,1,0,0x84,0);
        sljit_emit_op1(compiler,0x20,0x8c,0x10,4,0);
        sVar10 = 8;
        sVar9 = 0x84;
      }
      psVar5 = (sljit_jump *)0x0;
      local_60 = sljit_emit_cmp(compiler,0,1,0,sVar9,sVar10);
    }
    pbVar8 = (backtrack_common *)sljit_emit_label(compiler);
    pbVar4[1].prev = pbVar8;
    if (uVar3 != 0) {
      psVar7 = sljit_emit_cmp(compiler,3,0x8c,8,0x40,(ulong)uVar3);
      add_jump(compiler,&pbVar4->topbacktracks,psVar7);
    }
    if (1 < uVar11) {
      sljit_emit_op1(compiler,0x20,4,0,0x8c,0x10);
    }
    compile_ref_matchingpath(common,cc,&pbVar4->topbacktracks,1,1);
    sljit_emit_op1(compiler,0x20,0x8c,0,2,0);
    if ((uint)local_50 < 2) {
      if (uVar3 != 0) {
        sljit_emit_op2(compiler,0x60,0x8c,8,0x8c,8,0x40,1);
      }
    }
    else {
      sljit_emit_op1(compiler,0x20,1,0,0x8c,8);
      sljit_emit_op2(compiler,0x60,1,0,1,0,0x40,1);
      sljit_emit_op1(compiler,0x20,0x8c,8,1,0);
      psVar7 = sljit_emit_cmp(compiler,2,1,0,0x40,local_50);
      sljit_set_label(psVar7,(sljit_label *)pbVar4[1].prev);
    }
    if ((psVar5 != (sljit_jump *)0x0) &&
       (psVar6 = sljit_emit_label(compiler), psVar6 != (sljit_label *)0x0)) {
      psVar5->flags = (psVar5->flags & 0xfffffffffffffffcU) + 1;
      (psVar5->u).label = psVar6;
    }
    psVar6 = sljit_emit_label(compiler);
    sljit_set_label(local_60,psVar6);
    goto LAB_00140f9d;
  }
  if ((int)local_50 == 0) {
    allocate_stack(common,2);
    if (uVar11 < 2) {
      sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->ovector_start + (ulong)uVar13 * 8);
      sljit_emit_op1(compiler,0x20,0x8c,0,2,0);
      sljit_emit_op1(compiler,0x20,0x8c,8,0x40,0);
      sljit_emit_op2(compiler,0x60,0xc,0,0xc,0,0x40,8);
      local_60 = sljit_emit_cmp(compiler,0,1,0,0x8e,
                                (long)common->ovector_start + (ulong)uVar13 * 8 + 8);
    }
    else {
      sljit_emit_op1(compiler,0x20,0x8c,0,2,0);
      sljit_emit_op1(compiler,0x20,0x8c,8,0x40,0);
      sljit_emit_op2(compiler,0x60,0xc,0,0xc,0,0x40,8);
      compile_dnref_search(common,cc,(jump_list **)0x0);
      sljit_emit_op1(compiler,0x20,1,0,0x84,0);
      sljit_emit_op1(compiler,0x20,0x8e,0x18,4,0);
      local_60 = sljit_emit_cmp(compiler,0,1,0,0x84,8);
    }
    local_50 = 0;
    sljit_emit_op2(compiler,0x62,0xc,0,0xc,0,0x40,8);
  }
  else {
LAB_001406d1:
    allocate_stack(common,1);
    if (uVar11 < 2) {
      sljit_emit_op1(compiler,0x20,1,0,0x8e,(long)common->ovector_start + (ulong)uVar13 * 8);
      sljit_emit_op1(compiler,0x20,0x8c,0,0x40,0);
      psVar5 = sljit_emit_cmp(compiler,0,1,0,0x8e,(long)common->ovector_start + 8);
      add_jump(compiler,&pbVar4->topbacktracks,psVar5);
      local_60 = sljit_emit_cmp(compiler,0,1,0,0x8e,
                                (long)common->ovector_start + (ulong)uVar13 * 8 + 8);
    }
    else {
      sljit_emit_op1(compiler,0x20,0x8c,0,0x40,0);
      compile_dnref_search(common,cc,&pbVar4->topbacktracks);
      sljit_emit_op1(compiler,0x20,1,0,0x84,0);
      sljit_emit_op1(compiler,0x20,0x8e,0x18,4,0);
      local_60 = sljit_emit_cmp(compiler,0,1,0,0x84,8);
    }
  }
  if (local_70 >= 2 || (uint)local_50 >= 2) {
    sljit_emit_op1(compiler,0x20,0x8e,0x10,0x40,0);
  }
  psVar6 = sljit_emit_label(compiler);
  if (1 < uVar11) {
    sljit_emit_op1(compiler,0x20,4,0,0x8e,0x18);
  }
  compile_ref_matchingpath(common,cc,&pbVar4->topbacktracks,0,0);
  if (local_70 < 2 && (uint)local_50 < 2) {
LAB_00140f3a:
    if (local_70 == 0) {
      allocate_stack(common,1);
      sljit_emit_op1(compiler,0x20,0x8c,0,2,0);
      psVar5 = sljit_emit_jump(compiler,0x18);
      goto LAB_00140f76;
    }
  }
  else {
    sljit_emit_op1(compiler,0x20,1,0,0x8e,0x10);
    sljit_emit_op2(compiler,0x60,1,0,1,0,0x40,1);
    sljit_emit_op1(compiler,0x20,0x8e,0x10,1,0);
    if (1 < (uint)local_50) {
      psVar5 = sljit_emit_cmp(compiler,2,1,0,0x40,local_50);
      sljit_set_label(psVar5,psVar6);
    }
    if (local_70 < 2) goto LAB_00140f3a;
    psVar5 = sljit_emit_cmp(compiler,3,1,0,0x40,(ulong)local_70);
    allocate_stack(common,1);
    sljit_emit_op1(compiler,0x20,0x8c,0,2,0);
    psVar7 = sljit_emit_jump(compiler,0x18);
    sljit_set_label(psVar7,psVar6);
    psVar6 = sljit_emit_label(compiler);
LAB_00140f76:
    sljit_set_label(psVar5,psVar6);
  }
  psVar6 = sljit_emit_label(compiler);
  sljit_set_label(local_60,psVar6);
  pbVar8 = (backtrack_common *)sljit_emit_label(compiler);
  pbVar4[1].prev = pbVar8;
LAB_00140f9d:
  count_match(common);
  return local_38;
}

Assistant:

static SLJIT_INLINE PCRE2_SPTR compile_ref_iterator_matchingpath(compiler_common *common, PCRE2_SPTR cc, backtrack_common *parent)
{
DEFINE_COMPILER;
BOOL ref = (*cc == OP_REF || *cc == OP_REFI);
backtrack_common *backtrack;
PCRE2_UCHAR type;
int offset = 0;
struct sljit_label *label;
struct sljit_jump *zerolength;
struct sljit_jump *jump = NULL;
PCRE2_SPTR ccbegin = cc;
int min = 0, max = 0;
BOOL minimize;

PUSH_BACKTRACK(sizeof(ref_iterator_backtrack), cc, NULL);

if (ref)
  offset = GET2(cc, 1) << 1;
else
  cc += IMM2_SIZE;
type = cc[1 + IMM2_SIZE];

SLJIT_COMPILE_ASSERT((OP_CRSTAR & 0x1) == 0, crstar_opcode_must_be_even);
minimize = (type & 0x1) != 0;
switch(type)
  {
  case OP_CRSTAR:
  case OP_CRMINSTAR:
  min = 0;
  max = 0;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRPLUS:
  case OP_CRMINPLUS:
  min = 1;
  max = 0;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRQUERY:
  case OP_CRMINQUERY:
  min = 0;
  max = 1;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRRANGE:
  case OP_CRMINRANGE:
  min = GET2(cc, 1 + IMM2_SIZE + 1);
  max = GET2(cc, 1 + IMM2_SIZE + 1 + IMM2_SIZE);
  cc += 1 + IMM2_SIZE + 1 + 2 * IMM2_SIZE;
  break;
  default:
  SLJIT_UNREACHABLE();
  break;
  }

if (!minimize)
  {
  if (min == 0)
    {
    allocate_stack(common, 2);
    if (ref)
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 0);
    /* Temporary release of STR_PTR. */
    OP2(SLJIT_ADD, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
    /* Handles both invalid and empty cases. Since the minimum repeat,
    is zero the invalid case is basically the same as an empty case. */
    if (ref)
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    else
      {
      compile_dnref_search(common, ccbegin, NULL);
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1, TMP2, 0);
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
      }
    /* Restore if not zero length. */
    OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
    }
  else
    {
    allocate_stack(common, 1);
    if (ref)
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    if (ref)
      {
      add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
      }
    else
      {
      compile_dnref_search(common, ccbegin, &backtrack->topbacktracks);
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1, TMP2, 0);
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
      }
    }

  if (min > 1 || max > 1)
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0, SLJIT_IMM, 0);

  label = LABEL();
  if (!ref)
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1);
  compile_ref_matchingpath(common, ccbegin, &backtrack->topbacktracks, FALSE, FALSE);

  if (min > 1 || max > 1)
    {
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0);
    OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0, TMP1, 0);
    if (min > 1)
      CMPTO(SLJIT_LESS, TMP1, 0, SLJIT_IMM, min, label);
    if (max > 1)
      {
      jump = CMP(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, max);
      allocate_stack(common, 1);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
      JUMPTO(SLJIT_JUMP, label);
      JUMPHERE(jump);
      }
    }

  if (max == 0)
    {
    /* Includes min > 1 case as well. */
    allocate_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
    JUMPTO(SLJIT_JUMP, label);
    }

  JUMPHERE(zerolength);
  BACKTRACK_AS(ref_iterator_backtrack)->matchingpath = LABEL();

  count_match(common);
  return cc;
  }

allocate_stack(common, ref ? 2 : 3);
if (ref)
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
if (type != OP_CRMINSTAR)
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 0);

if (min == 0)
  {
  /* Handles both invalid and empty cases. Since the minimum repeat,
  is zero the invalid case is basically the same as an empty case. */
  if (ref)
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
  else
    {
    compile_dnref_search(common, ccbegin, NULL);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), TMP2, 0);
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
    }
  /* Length is non-zero, we can match real repeats. */
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
  jump = JUMP(SLJIT_JUMP);
  }
else
  {
  if (ref)
    {
    add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    }
  else
    {
    compile_dnref_search(common, ccbegin, &backtrack->topbacktracks);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), TMP2, 0);
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
    }
  }

BACKTRACK_AS(ref_iterator_backtrack)->matchingpath = LABEL();
if (max > 0)
  add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_GREATER_EQUAL, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, max));

if (!ref)
  OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(2));
compile_ref_matchingpath(common, ccbegin, &backtrack->topbacktracks, TRUE, TRUE);
OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);

if (min > 1)
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(1));
  OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, 1);
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), TMP1, 0);
  CMPTO(SLJIT_LESS, TMP1, 0, SLJIT_IMM, min, BACKTRACK_AS(ref_iterator_backtrack)->matchingpath);
  }
else if (max > 0)
  OP2(SLJIT_ADD, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 1);

if (jump != NULL)
  JUMPHERE(jump);
JUMPHERE(zerolength);

count_match(common);
return cc;
}